

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.cpp
# Opt level: O0

void __thiscall
duckdb::RangeInfoStruct<duckdb::TimestampRangeInfo,_true>::RangeInfoStruct
          (RangeInfoStruct<duckdb::TimestampRangeInfo,_true> *this,DataChunk *args_p)

{
  idx_t iVar1;
  undefined8 uVar2;
  UnifiedVectorFormat *in_RSI;
  undefined8 *in_RDI;
  Vector *unaff_retaddr;
  string *in_stack_ffffffffffffff28;
  vector<duckdb::Vector,_true> *in_stack_ffffffffffffff30;
  UnifiedVectorFormat *in_stack_ffffffffffffff40;
  allocator *paVar3;
  undefined8 *local_50;
  allocator local_41;
  string local_40 [48];
  undefined8 *count;
  
  *in_RDI = in_RSI;
  local_50 = in_RDI + 1;
  count = in_RDI;
  do {
    UnifiedVectorFormat::UnifiedVectorFormat(in_stack_ffffffffffffff40);
    local_50 = local_50 + 9;
  } while (local_50 != in_RDI + 0x1c);
  iVar1 = DataChunk::ColumnCount((DataChunk *)0x2064881);
  if (iVar1 == 1) {
    vector<duckdb::Vector,_true>::operator[]
              (in_stack_ffffffffffffff30,(size_type)in_stack_ffffffffffffff28);
    DataChunk::size((DataChunk *)*in_RDI);
    Vector::ToUnifiedFormat(unaff_retaddr,(idx_t)count,in_RSI);
  }
  else if (iVar1 == 2) {
    vector<duckdb::Vector,_true>::operator[]
              (in_stack_ffffffffffffff30,(size_type)in_stack_ffffffffffffff28);
    DataChunk::size((DataChunk *)*in_RDI);
    Vector::ToUnifiedFormat(unaff_retaddr,(idx_t)count,in_RSI);
    vector<duckdb::Vector,_true>::operator[]
              (in_stack_ffffffffffffff30,(size_type)in_stack_ffffffffffffff28);
    DataChunk::size((DataChunk *)*in_RDI);
    Vector::ToUnifiedFormat(unaff_retaddr,(idx_t)count,in_RSI);
  }
  else {
    if (iVar1 != 3) {
      uVar2 = __cxa_allocate_exception(0x10);
      paVar3 = &local_41;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_40,"Unsupported number of parameters for range",paVar3);
      InternalException::InternalException
                ((InternalException *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      __cxa_throw(uVar2,&InternalException::typeinfo,InternalException::~InternalException);
    }
    vector<duckdb::Vector,_true>::operator[]
              (in_stack_ffffffffffffff30,(size_type)in_stack_ffffffffffffff28);
    DataChunk::size((DataChunk *)*in_RDI);
    Vector::ToUnifiedFormat(unaff_retaddr,(idx_t)count,in_RSI);
    vector<duckdb::Vector,_true>::operator[]
              (in_stack_ffffffffffffff30,(size_type)in_stack_ffffffffffffff28);
    DataChunk::size((DataChunk *)*in_RDI);
    Vector::ToUnifiedFormat(unaff_retaddr,(idx_t)count,in_RSI);
    vector<duckdb::Vector,_true>::operator[]
              (in_stack_ffffffffffffff30,(size_type)in_stack_ffffffffffffff28);
    DataChunk::size((DataChunk *)*in_RDI);
    Vector::ToUnifiedFormat(unaff_retaddr,(idx_t)count,in_RSI);
  }
  return;
}

Assistant:

explicit RangeInfoStruct(DataChunk &args_p) : args(args_p) {
		switch (args.ColumnCount()) {
		case 1:
			args.data[0].ToUnifiedFormat(args.size(), vdata[0]);
			break;
		case 2:
			args.data[0].ToUnifiedFormat(args.size(), vdata[0]);
			args.data[1].ToUnifiedFormat(args.size(), vdata[1]);
			break;
		case 3:
			args.data[0].ToUnifiedFormat(args.size(), vdata[0]);
			args.data[1].ToUnifiedFormat(args.size(), vdata[1]);
			args.data[2].ToUnifiedFormat(args.size(), vdata[2]);
			break;
		default:
			throw InternalException("Unsupported number of parameters for range");
		}
	}